

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void add_range_(Integer *me,Integer *LO1,Integer *HI1,Integer *ndim1,Integer *LO2,Integer *HI2,
               Integer *ndim2)

{
  int iVar1;
  int lo2 [7];
  int hi2 [7];
  int lo1 [7];
  int hi1 [7];
  char msg [100];
  int local_118 [8];
  int local_f8 [8];
  int local_d8 [8];
  int local_b8 [8];
  char local_98 [104];
  
  if (7 < (int)*ndim1) {
    __assert_fail("(int)*ndim1 <= GA_MAX_DIM",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                  ,0x18a,
                  "void add_range_(Integer *, Integer *, Integer *, Integer *, Integer *, Integer *, Integer *)"
                 );
  }
  if ((int)*ndim2 < 8) {
    sprintf(local_98,"%d: ",(ulong)(uint)*me);
    iVar1 = (int)*ndim1;
    f2c_copy_indices(HI1,local_b8,iVar1);
    f2c_copy_indices(LO1,local_d8,iVar1);
    print_range_internal(local_98,iVar1,local_d8,local_b8,"");
    builtin_strncpy(local_98,"+= ",4);
    iVar1 = (int)*ndim2;
    f2c_copy_indices(HI2,local_f8,iVar1);
    f2c_copy_indices(LO2,local_118,iVar1);
    print_range_internal(local_98,iVar1,local_118,local_f8,"\n");
    return;
  }
  __assert_fail("(int)*ndim2 <= GA_MAX_DIM",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                ,0x18b,
                "void add_range_(Integer *, Integer *, Integer *, Integer *, Integer *, Integer *, Integer *)"
               );
}

Assistant:

void FATR add_range_(Integer *me, Integer LO1[], Integer HI1[], Integer *ndim1, Integer LO2[], Integer HI2[], Integer *ndim2)
{
int hi1[GA_MAX_DIM], lo1[GA_MAX_DIM], hi2[GA_MAX_DIM], lo2[GA_MAX_DIM];
char msg[100];

    assert((int)*ndim1 <= GA_MAX_DIM);
    assert((int)*ndim2 <= GA_MAX_DIM);
    sprintf(msg,"%d: ",(int)*me);
    f2c_copy_indices(HI1, hi1, (int)*ndim1);
    f2c_copy_indices(LO1, lo1, (int)*ndim1);
    print_range_internal(msg,(int)*ndim1, lo1, hi1, "");
    sprintf(msg,"+= ");
    f2c_copy_indices(HI2, hi2, (int)*ndim2);
    f2c_copy_indices(LO2, lo2, (int)*ndim2);
    print_range_internal(msg,(int)*ndim2, lo2, hi2, "\n");
}